

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O2

void __thiscall
btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb
          (btQuantizedBvh *this,btQuantizedBvhNode *currentNode,btNodeOverlapCallback *nodeCallback,
          unsigned_short *quantizedQueryAabbMin,unsigned_short *quantizedQueryAabbMax)

{
  btQuantizedBvhNode *pbVar1;
  uint uVar2;
  btQuantizedBvhNode *pbVar3;
  
  while( true ) {
    uVar2 = testQuantizedAabbAgainstQuantizedAabb
                      (quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,
                       currentNode->m_quantizedAabbMax);
    if (uVar2 == 0) {
      return;
    }
    uVar2 = currentNode->m_escapeIndexOrTriangleIndex;
    if (-1 < (int)uVar2) break;
    walkRecursiveQuantizedTreeAgainstQueryAabb
              (this,currentNode + 1,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
    pbVar1 = currentNode + 1;
    pbVar3 = currentNode + (ulong)(uint)-pbVar1->m_escapeIndexOrTriangleIndex + 1;
    currentNode = currentNode + 2;
    if (pbVar1->m_escapeIndexOrTriangleIndex < 0) {
      currentNode = pbVar3;
    }
  }
  (*nodeCallback->_vptr_btNodeOverlapCallback[2])
            (nodeCallback,(ulong)(uVar2 >> 0x15),(ulong)(uVar2 & 0x1fffff));
  return;
}

Assistant:

void btQuantizedBvh::walkRecursiveQuantizedTreeAgainstQueryAabb(const btQuantizedBvhNode* currentNode,btNodeOverlapCallback* nodeCallback,unsigned short int* quantizedQueryAabbMin,unsigned short int* quantizedQueryAabbMax) const
{
	btAssert(m_useQuantization);
	
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	//PCK: unsigned instead of bool
	aabbOverlap = testQuantizedAabbAgainstQuantizedAabb(quantizedQueryAabbMin,quantizedQueryAabbMax,currentNode->m_quantizedAabbMin,currentNode->m_quantizedAabbMax);
	isLeafNode = currentNode->isLeafNode();
		
	//PCK: unsigned instead of bool
	if (aabbOverlap != 0)
	{
		if (isLeafNode)
		{
			nodeCallback->processNode(currentNode->getPartId(),currentNode->getTriangleIndex());
		} else
		{
			//process left and right children
			const btQuantizedBvhNode* leftChildNode = currentNode+1;
			walkRecursiveQuantizedTreeAgainstQueryAabb(leftChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);

			const btQuantizedBvhNode* rightChildNode = leftChildNode->isLeafNode() ? leftChildNode+1:leftChildNode+leftChildNode->getEscapeIndex();
			walkRecursiveQuantizedTreeAgainstQueryAabb(rightChildNode,nodeCallback,quantizedQueryAabbMin,quantizedQueryAabbMax);
		}
	}		
}